

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

FState * __thiscall AActor::GetRaiseState(AActor *this)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  FState *pFVar4;
  bool bVar5;
  FName local_14;
  PClass *pPVar3;
  
  pPVar1 = APlayerPawn::RegistrationInfo.MyClass;
  if (((this->flags).Value & 0x100000) == 0) {
    return (FState *)0x0;
  }
  if ((this->tics == -1) || ((this->state->StateFlags & 0x20) != 0)) {
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      pFVar4 = FindState(this,&local_14);
      return pFVar4;
    }
  }
  return (FState *)0x0;
}

Assistant:

FState *AActor::GetRaiseState()
{
	if (!(flags & MF_CORPSE))
	{
		return NULL;	// not a monster
	}

	if (tics != -1 && // not lying still yet
		!state->GetCanRaise()) // or not ready to be raised yet
	{
		return NULL;
	}

	if (IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{
		return NULL;	// do not resurrect players
	}

	return FindState(NAME_Raise);
}